

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O1

void test_decimal128_from_string__nan(void)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  bson_decimal128_t dec;
  char cStack_2b8;
  char cStack_2b7;
  char cStack_2b6;
  char cStack_2b5;
  char cStack_2b4;
  char cStack_2b3;
  char cStack_2b2;
  char cStack_2b1;
  char cStack_2b0;
  char cStack_2af;
  char cStack_2ae;
  char cStack_2ad;
  char cStack_2ac;
  char cStack_2ab;
  char cStack_2aa;
  char cStack_2a9;
  char cStack_2a8;
  char cStack_2a7;
  char cStack_2a6;
  char cStack_2a5;
  char cStack_2a4;
  char cStack_2a3;
  char cStack_2a2;
  char cStack_2a1;
  char cStack_2a0;
  char cStack_29f;
  char cStack_29e;
  char cStack_29d;
  char cStack_29c;
  char cStack_29b;
  char cStack_29a;
  char cStack_299;
  char cStack_298;
  char cStack_297;
  char cStack_296;
  char cStack_295;
  char cStack_294;
  char cStack_293;
  char cStack_292;
  char cStack_291;
  char cStack_290;
  char cStack_28f;
  char cStack_28e;
  char cStack_28d;
  char cStack_28c;
  char cStack_28b;
  char cStack_28a;
  char cStack_289;
  char cStack_288;
  char cStack_287;
  char cStack_286;
  char cStack_285;
  char cStack_284;
  char cStack_283;
  char cStack_282;
  char cStack_281;
  char cStack_280;
  char cStack_27f;
  char cStack_27e;
  char cStack_27d;
  char cStack_27c;
  char cStack_27b;
  char cStack_27a;
  char cStack_279;
  code *pcStack_278;
  undefined8 uStack_268;
  undefined8 uStack_260;
  char cStack_258;
  char cStack_257;
  char cStack_256;
  char cStack_255;
  char cStack_254;
  char cStack_253;
  char cStack_252;
  char cStack_251;
  char cStack_250;
  char cStack_24f;
  char cStack_24e;
  char cStack_24d;
  char cStack_24c;
  char cStack_24b;
  char cStack_24a;
  char cStack_249;
  char cStack_248;
  char cStack_247;
  char cStack_246;
  char cStack_245;
  char cStack_244;
  char cStack_243;
  char cStack_242;
  char cStack_241;
  char cStack_240;
  char cStack_23f;
  char cStack_23e;
  char cStack_23d;
  char cStack_23c;
  char cStack_23b;
  char cStack_23a;
  char cStack_239;
  char cStack_238;
  char cStack_237;
  char cStack_236;
  char cStack_235;
  char cStack_234;
  char cStack_233;
  char cStack_232;
  char cStack_231;
  char cStack_230;
  char cStack_22f;
  char cStack_22e;
  char cStack_22d;
  char cStack_22c;
  char cStack_22b;
  char cStack_22a;
  char cStack_229;
  char cStack_228;
  char cStack_227;
  char cStack_226;
  char cStack_225;
  char cStack_224;
  char cStack_223;
  char cStack_222;
  char cStack_221;
  char cStack_220;
  char cStack_21f;
  char cStack_21e;
  char cStack_21d;
  char cStack_21c;
  char cStack_21b;
  char cStack_21a;
  char cStack_219;
  char *pcStack_218;
  code *pcStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  char cStack_1f8;
  char cStack_1f7;
  char cStack_1f6;
  char cStack_1f5;
  char cStack_1f4;
  char cStack_1f3;
  char cStack_1f2;
  char cStack_1f1;
  char cStack_1f0;
  char cStack_1ef;
  char cStack_1ee;
  char cStack_1ed;
  char cStack_1ec;
  char cStack_1eb;
  char cStack_1ea;
  char cStack_1e9;
  char cStack_1e8;
  char cStack_1e7;
  char cStack_1e6;
  char cStack_1e5;
  char cStack_1e4;
  char cStack_1e3;
  char cStack_1e2;
  char cStack_1e1;
  char cStack_1e0;
  char cStack_1df;
  char cStack_1de;
  char cStack_1dd;
  char cStack_1dc;
  char cStack_1db;
  char cStack_1da;
  char cStack_1d9;
  char cStack_1d8;
  char cStack_1d7;
  char cStack_1d6;
  char cStack_1d5;
  char cStack_1d4;
  char cStack_1d3;
  char cStack_1d2;
  char cStack_1d1;
  char cStack_1d0;
  char cStack_1cf;
  char cStack_1ce;
  char cStack_1cd;
  char cStack_1cc;
  char cStack_1cb;
  char cStack_1ca;
  char cStack_1c9;
  char cStack_1c8;
  char cStack_1c7;
  char cStack_1c6;
  char cStack_1c5;
  char cStack_1c4;
  char cStack_1c3;
  char cStack_1c2;
  char cStack_1c1;
  char cStack_1c0;
  char cStack_1bf;
  char cStack_1be;
  char cStack_1bd;
  char cStack_1bc;
  char cStack_1bb;
  char cStack_1ba;
  char cStack_1b9;
  char cStack_1b8;
  char cStack_1b7;
  char cStack_1b6;
  char cStack_1b5;
  char cStack_1b4;
  char cStack_1b3;
  char cStack_1b2;
  char cStack_1b1;
  char cStack_1b0;
  char cStack_1af;
  char cStack_1ae;
  char cStack_1ad;
  char cStack_1ac;
  char cStack_1ab;
  char cStack_1aa;
  char cStack_1a9;
  code *pcStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  char cStack_190;
  char cStack_18f;
  char cStack_18e;
  char cStack_18d;
  char cStack_18c;
  char cStack_18b;
  char cStack_18a;
  char cStack_189;
  char cStack_188;
  char cStack_187;
  char cStack_186;
  char cStack_185;
  char cStack_184;
  char cStack_183;
  char cStack_182;
  char cStack_181;
  undefined1 auStack_180 [16];
  undefined1 auStack_170 [16];
  char cStack_160;
  char cStack_15f;
  char cStack_15e;
  char cStack_15d;
  char cStack_15c;
  char cStack_15b;
  char cStack_15a;
  char cStack_159;
  char cStack_158;
  char cStack_157;
  char cStack_156;
  char cStack_155;
  char cStack_154;
  char cStack_153;
  char cStack_152;
  char cStack_151;
  char cStack_150;
  char cStack_14f;
  char cStack_14e;
  char cStack_14d;
  char cStack_14c;
  char cStack_14b;
  char cStack_14a;
  char cStack_149;
  char cStack_148;
  char cStack_147;
  char cStack_146;
  char cStack_145;
  char cStack_144;
  char cStack_143;
  char cStack_142;
  char cStack_141;
  char cStack_140;
  char cStack_13f;
  char cStack_13e;
  char cStack_13d;
  char cStack_13c;
  char cStack_13b;
  char cStack_13a;
  char cStack_139;
  char cStack_138;
  char cStack_137;
  char cStack_136;
  char cStack_135;
  char cStack_134;
  char cStack_133;
  char cStack_132;
  char cStack_131;
  char cStack_130;
  char cStack_12f;
  char cStack_12e;
  char cStack_12d;
  char cStack_12c;
  char cStack_12b;
  char cStack_12a;
  char cStack_129;
  char cStack_128;
  char cStack_127;
  char cStack_126;
  char cStack_125;
  char cStack_124;
  char cStack_123;
  char cStack_122;
  char cStack_121;
  code *pcStack_120;
  undefined8 uStack_110;
  undefined8 uStack_108;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  char cStack_f8;
  char cStack_f7;
  char cStack_f6;
  char cStack_f5;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  char cStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  char cStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  char cStack_e9;
  char cStack_e8;
  char cStack_e7;
  char cStack_e6;
  char cStack_e5;
  char cStack_e4;
  char cStack_e3;
  char cStack_e2;
  char cStack_e1;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  char cStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  char cStack_d9;
  char cStack_d8;
  char cStack_d7;
  char cStack_d6;
  char cStack_d5;
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  char cStack_d1;
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  char cStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  char cStack_c9;
  char cStack_c8;
  char cStack_c7;
  char cStack_c6;
  char cStack_c5;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  char cStack_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  char cStack_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  char cStack_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  char cStack_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  char cStack_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  char cStack_68;
  char cStack_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  undefined1 *puStack_60;
  code *pcStack_58;
  undefined1 auStack_48 [8];
  long lStack_40;
  undefined1 *puStack_38;
  code *pcStack_30;
  undefined1 local_20 [8];
  long local_18;
  
  pcStack_30 = (code *)0x1284b7;
  bson_decimal128_from_string("NaN",local_20);
  if (local_18 == 0x7c00000000000000) {
    pcStack_30 = (code *)0x1284d5;
    bson_decimal128_from_string("+NaN",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_001285cc;
    pcStack_30 = (code *)0x1284f3;
    bson_decimal128_from_string("-NaN",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_001285d1;
    pcStack_30 = (code *)0x128511;
    bson_decimal128_from_string("-nan",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_001285d6;
    pcStack_30 = (code *)0x12852f;
    bson_decimal128_from_string("1e",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_001285db;
    pcStack_30 = (code *)0x12854d;
    bson_decimal128_from_string("+nan",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_001285e0;
    pcStack_30 = (code *)0x12856b;
    bson_decimal128_from_string("nan",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_001285e5;
    pcStack_30 = (code *)0x128585;
    bson_decimal128_from_string("Nan",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_001285ea;
    pcStack_30 = (code *)0x12859f;
    bson_decimal128_from_string("+Nan",local_20);
    if (local_18 != 0x7c00000000000000) goto LAB_001285ef;
    pcStack_30 = (code *)0x1285b9;
    bson_decimal128_from_string("-Nan",local_20);
    if (local_18 == 0x7c00000000000000) {
      return;
    }
  }
  else {
    pcStack_30 = (code *)0x1285cc;
    test_decimal128_from_string__nan_cold_1();
LAB_001285cc:
    pcStack_30 = (code *)0x1285d1;
    test_decimal128_from_string__nan_cold_2();
LAB_001285d1:
    pcStack_30 = (code *)0x1285d6;
    test_decimal128_from_string__nan_cold_3();
LAB_001285d6:
    pcStack_30 = (code *)0x1285db;
    test_decimal128_from_string__nan_cold_4();
LAB_001285db:
    pcStack_30 = (code *)0x1285e0;
    test_decimal128_from_string__nan_cold_5();
LAB_001285e0:
    pcStack_30 = (code *)0x1285e5;
    test_decimal128_from_string__nan_cold_6();
LAB_001285e5:
    pcStack_30 = (code *)0x1285ea;
    test_decimal128_from_string__nan_cold_7();
LAB_001285ea:
    pcStack_30 = (code *)0x1285ef;
    test_decimal128_from_string__nan_cold_8();
LAB_001285ef:
    pcStack_30 = (code *)0x1285f4;
    test_decimal128_from_string__nan_cold_9();
  }
  pcStack_30 = test_decimal128_from_string__infinity;
  test_decimal128_from_string__nan_cold_10();
  pcStack_30 = (code *)0x7c00000000000000;
  uVar2 = 0x7800000000000000;
  pcStack_58 = (code *)0x12861e;
  puStack_38 = local_20;
  bson_decimal128_from_string("Infinity",auStack_48);
  if (lStack_40 == 0x7800000000000000) {
    pcStack_58 = (code *)0x128638;
    bson_decimal128_from_string("+Infinity",auStack_48);
    if (lStack_40 != 0x7800000000000000) goto LAB_001286a3;
    pcStack_58 = (code *)0x128652;
    bson_decimal128_from_string("+Inf",auStack_48);
    if (lStack_40 != 0x7800000000000000) goto LAB_001286a8;
    uVar2 = 0xf800000000000000;
    pcStack_58 = (code *)0x128676;
    bson_decimal128_from_string("-Inf",auStack_48);
    if (lStack_40 != -0x800000000000000) goto LAB_001286ad;
    pcStack_58 = (code *)0x128690;
    bson_decimal128_from_string("-Infinity",auStack_48);
    if (lStack_40 == -0x800000000000000) {
      return;
    }
  }
  else {
    pcStack_58 = (code *)0x1286a3;
    test_decimal128_from_string__infinity_cold_1();
LAB_001286a3:
    pcStack_58 = (code *)0x1286a8;
    test_decimal128_from_string__infinity_cold_2();
LAB_001286a8:
    pcStack_58 = (code *)0x1286ad;
    test_decimal128_from_string__infinity_cold_3();
LAB_001286ad:
    pcStack_58 = (code *)0x1286b2;
    test_decimal128_from_string__infinity_cold_4();
  }
  pcStack_58 = test_decimal128_from_string__simple;
  test_decimal128_from_string__infinity_cold_5();
  pcStack_120 = (code *)0x1286e2;
  puStack_60 = auStack_48;
  pcStack_58 = (code *)uVar2;
  bson_decimal128_from_string("1",&cStack_70);
  pcStack_120 = (code *)0x1286f6;
  bson_decimal128_from_string("-1",&cStack_80);
  pcStack_120 = (code *)0x12870a;
  bson_decimal128_from_string("0",&cStack_90);
  pcStack_120 = (code *)0x12871b;
  bson_decimal128_from_string("-0",&cStack_a0);
  pcStack_120 = (code *)0x12872c;
  bson_decimal128_from_string("12345678901234567",&cStack_b0);
  pcStack_120 = (code *)0x12873d;
  bson_decimal128_from_string("989898983458",&cStack_c0);
  pcStack_120 = (code *)0x12874e;
  bson_decimal128_from_string("-12345678901234567",&cStack_d0);
  pcStack_120 = (code *)0x12875f;
  bson_decimal128_from_string("0.12345",&cStack_e0);
  pcStack_120 = (code *)0x128770;
  bson_decimal128_from_string("0.0012345",&cStack_f0);
  pcStack_120 = (code *)0x128781;
  bson_decimal128_from_string("00012345678901234567",&cStack_100);
  uStack_108 = 0x3040000000000000;
  uStack_110 = 1;
  auVar3[0] = -(cStack_70 == '\x01');
  auVar3[1] = -(cStack_6f == '\0');
  auVar3[2] = -(cStack_6e == '\0');
  auVar3[3] = -(cStack_6d == '\0');
  auVar3[4] = -(cStack_6c == '\0');
  auVar3[5] = -(cStack_6b == '\0');
  auVar3[6] = -(cStack_6a == '\0');
  auVar3[7] = -(cStack_69 == '\0');
  auVar3[8] = -(cStack_68 == '\0');
  auVar3[9] = -(cStack_67 == '\0');
  auVar3[10] = -(cStack_66 == '\0');
  auVar3[0xb] = -(cStack_65 == '\0');
  auVar3[0xc] = -(cStack_64 == '\0');
  auVar3[0xd] = -(cStack_63 == '\0');
  auVar3[0xe] = -(cStack_62 == '@');
  auVar3[0xf] = -(cStack_61 == '0');
  if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf) ==
      0xffff) {
    uStack_108 = 0xb040000000000000;
    uStack_110 = 1;
    auVar4[0] = -(cStack_80 == '\x01');
    auVar4[1] = -(cStack_7f == '\0');
    auVar4[2] = -(cStack_7e == '\0');
    auVar4[3] = -(cStack_7d == '\0');
    auVar4[4] = -(cStack_7c == '\0');
    auVar4[5] = -(cStack_7b == '\0');
    auVar4[6] = -(cStack_7a == '\0');
    auVar4[7] = -(cStack_79 == '\0');
    auVar4[8] = -(cStack_78 == '\0');
    auVar4[9] = -(cStack_77 == '\0');
    auVar4[10] = -(cStack_76 == '\0');
    auVar4[0xb] = -(cStack_75 == '\0');
    auVar4[0xc] = -(cStack_74 == '\0');
    auVar4[0xd] = -(cStack_73 == '\0');
    auVar4[0xe] = -(cStack_72 == '@');
    auVar4[0xf] = -(cStack_71 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128976;
    uStack_108 = 0x3040000000000000;
    uStack_110 = 0;
    auVar5[0] = -(cStack_90 == '\0');
    auVar5[1] = -(cStack_8f == '\0');
    auVar5[2] = -(cStack_8e == '\0');
    auVar5[3] = -(cStack_8d == '\0');
    auVar5[4] = -(cStack_8c == '\0');
    auVar5[5] = -(cStack_8b == '\0');
    auVar5[6] = -(cStack_8a == '\0');
    auVar5[7] = -(cStack_89 == '\0');
    auVar5[8] = -(cStack_88 == '\0');
    auVar5[9] = -(cStack_87 == '\0');
    auVar5[10] = -(cStack_86 == '\0');
    auVar5[0xb] = -(cStack_85 == '\0');
    auVar5[0xc] = -(cStack_84 == '\0');
    auVar5[0xd] = -(cStack_83 == '\0');
    auVar5[0xe] = -(cStack_82 == '@');
    auVar5[0xf] = -(cStack_81 == '0');
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_0012897b;
    uStack_108 = 0xb040000000000000;
    uStack_110 = 0;
    auVar6[0] = -(cStack_a0 == '\0');
    auVar6[1] = -(cStack_9f == '\0');
    auVar6[2] = -(cStack_9e == '\0');
    auVar6[3] = -(cStack_9d == '\0');
    auVar6[4] = -(cStack_9c == '\0');
    auVar6[5] = -(cStack_9b == '\0');
    auVar6[6] = -(cStack_9a == '\0');
    auVar6[7] = -(cStack_99 == '\0');
    auVar6[8] = -(cStack_98 == '\0');
    auVar6[9] = -(cStack_97 == '\0');
    auVar6[10] = -(cStack_96 == '\0');
    auVar6[0xb] = -(cStack_95 == '\0');
    auVar6[0xc] = -(cStack_94 == '\0');
    auVar6[0xd] = -(cStack_93 == '\0');
    auVar6[0xe] = -(cStack_92 == '@');
    auVar6[0xf] = -(cStack_91 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128980;
    uStack_108 = 0x3040000000000000;
    uStack_110 = 0x2bdc545d6b4b87;
    auVar7[0] = -(cStack_b0 == -0x79);
    auVar7[1] = -(cStack_af == 'K');
    auVar7[2] = -(cStack_ae == 'k');
    auVar7[3] = -(cStack_ad == ']');
    auVar7[4] = -(cStack_ac == 'T');
    auVar7[5] = -(cStack_ab == -0x24);
    auVar7[6] = -(cStack_aa == '+');
    auVar7[7] = -(cStack_a9 == '\0');
    auVar7[8] = -(cStack_a8 == '\0');
    auVar7[9] = -(cStack_a7 == '\0');
    auVar7[10] = -(cStack_a6 == '\0');
    auVar7[0xb] = -(cStack_a5 == '\0');
    auVar7[0xc] = -(cStack_a4 == '\0');
    auVar7[0xd] = -(cStack_a3 == '\0');
    auVar7[0xe] = -(cStack_a2 == '@');
    auVar7[0xf] = -(cStack_a1 == '0');
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_00128985;
    uStack_108 = 0x3040000000000000;
    uStack_110 = 0xe67a93c822;
    auVar8[0] = -(cStack_c0 == '\"');
    auVar8[1] = -(cStack_bf == -0x38);
    auVar8[2] = -(cStack_be == -0x6d);
    auVar8[3] = -(cStack_bd == 'z');
    auVar8[4] = -(cStack_bc == -0x1a);
    auVar8[5] = -(cStack_bb == '\0');
    auVar8[6] = -(cStack_ba == '\0');
    auVar8[7] = -(cStack_b9 == '\0');
    auVar8[8] = -(cStack_b8 == '\0');
    auVar8[9] = -(cStack_b7 == '\0');
    auVar8[10] = -(cStack_b6 == '\0');
    auVar8[0xb] = -(cStack_b5 == '\0');
    auVar8[0xc] = -(cStack_b4 == '\0');
    auVar8[0xd] = -(cStack_b3 == '\0');
    auVar8[0xe] = -(cStack_b2 == '@');
    auVar8[0xf] = -(cStack_b1 == '0');
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_0012898a;
    uStack_108 = 0xb040000000000000;
    uStack_110 = 0x2bdc545d6b4b87;
    auVar9[0] = -(cStack_d0 == -0x79);
    auVar9[1] = -(cStack_cf == 'K');
    auVar9[2] = -(cStack_ce == 'k');
    auVar9[3] = -(cStack_cd == ']');
    auVar9[4] = -(cStack_cc == 'T');
    auVar9[5] = -(cStack_cb == -0x24);
    auVar9[6] = -(cStack_ca == '+');
    auVar9[7] = -(cStack_c9 == '\0');
    auVar9[8] = -(cStack_c8 == '\0');
    auVar9[9] = -(cStack_c7 == '\0');
    auVar9[10] = -(cStack_c6 == '\0');
    auVar9[0xb] = -(cStack_c5 == '\0');
    auVar9[0xc] = -(cStack_c4 == '\0');
    auVar9[0xd] = -(cStack_c3 == '\0');
    auVar9[0xe] = -(cStack_c2 == '@');
    auVar9[0xf] = -(cStack_c1 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_0012898f;
    uStack_108 = 0x3036000000000000;
    uStack_110 = 0x3039;
    auVar10[0] = -(cStack_e0 == '9');
    auVar10[1] = -(cStack_df == '0');
    auVar10[2] = -(cStack_de == '\0');
    auVar10[3] = -(cStack_dd == '\0');
    auVar10[4] = -(cStack_dc == '\0');
    auVar10[5] = -(cStack_db == '\0');
    auVar10[6] = -(cStack_da == '\0');
    auVar10[7] = -(cStack_d9 == '\0');
    auVar10[8] = -(cStack_d8 == '\0');
    auVar10[9] = -(cStack_d7 == '\0');
    auVar10[10] = -(cStack_d6 == '\0');
    auVar10[0xb] = -(cStack_d5 == '\0');
    auVar10[0xc] = -(cStack_d4 == '\0');
    auVar10[0xd] = -(cStack_d3 == '\0');
    auVar10[0xe] = -(cStack_d2 == '6');
    auVar10[0xf] = -(cStack_d1 == '0');
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128994;
    uStack_108 = 0x3032000000000000;
    uStack_110 = 0x3039;
    auVar11[0] = -(cStack_f0 == '9');
    auVar11[1] = -(cStack_ef == '0');
    auVar11[2] = -(cStack_ee == '\0');
    auVar11[3] = -(cStack_ed == '\0');
    auVar11[4] = -(cStack_ec == '\0');
    auVar11[5] = -(cStack_eb == '\0');
    auVar11[6] = -(cStack_ea == '\0');
    auVar11[7] = -(cStack_e9 == '\0');
    auVar11[8] = -(cStack_e8 == '\0');
    auVar11[9] = -(cStack_e7 == '\0');
    auVar11[10] = -(cStack_e6 == '\0');
    auVar11[0xb] = -(cStack_e5 == '\0');
    auVar11[0xc] = -(cStack_e4 == '\0');
    auVar11[0xd] = -(cStack_e3 == '\0');
    auVar11[0xe] = -(cStack_e2 == '2');
    auVar11[0xf] = -(cStack_e1 == '0');
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128999;
    uStack_108 = 0x3040000000000000;
    uStack_110 = 0x2bdc545d6b4b87;
    auVar12[0] = -(cStack_100 == -0x79);
    auVar12[1] = -(cStack_ff == 'K');
    auVar12[2] = -(cStack_fe == 'k');
    auVar12[3] = -(cStack_fd == ']');
    auVar12[4] = -(cStack_fc == 'T');
    auVar12[5] = -(cStack_fb == -0x24);
    auVar12[6] = -(cStack_fa == '+');
    auVar12[7] = -(cStack_f9 == '\0');
    auVar12[8] = -(cStack_f8 == '\0');
    auVar12[9] = -(cStack_f7 == '\0');
    auVar12[10] = -(cStack_f6 == '\0');
    auVar12[0xb] = -(cStack_f5 == '\0');
    auVar12[0xc] = -(cStack_f4 == '\0');
    auVar12[0xd] = -(cStack_f3 == '\0');
    auVar12[0xe] = -(cStack_f2 == '@');
    auVar12[0xf] = -(cStack_f1 == '0');
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_120 = (code *)0x128976;
    test_decimal128_from_string__simple_cold_1();
LAB_00128976:
    pcStack_120 = (code *)0x12897b;
    test_decimal128_from_string__simple_cold_2();
LAB_0012897b:
    pcStack_120 = (code *)0x128980;
    test_decimal128_from_string__simple_cold_3();
LAB_00128980:
    pcStack_120 = (code *)0x128985;
    test_decimal128_from_string__simple_cold_4();
LAB_00128985:
    pcStack_120 = (code *)0x12898a;
    test_decimal128_from_string__simple_cold_5();
LAB_0012898a:
    pcStack_120 = (code *)0x12898f;
    test_decimal128_from_string__simple_cold_6();
LAB_0012898f:
    pcStack_120 = (code *)0x128994;
    test_decimal128_from_string__simple_cold_7();
LAB_00128994:
    pcStack_120 = (code *)0x128999;
    test_decimal128_from_string__simple_cold_8();
LAB_00128999:
    pcStack_120 = (code *)0x12899e;
    test_decimal128_from_string__simple_cold_9();
  }
  pcStack_120 = test_decimal128_from_string__scientific;
  test_decimal128_from_string__simple_cold_10();
  pcVar1 = &cStack_130;
  pcStack_1a8 = (code *)0x1289bf;
  pcStack_120 = (code *)&cStack_70;
  bson_decimal128_from_string("10e0",pcVar1);
  pcStack_1a8 = (code *)0x1289d0;
  bson_decimal128_from_string("1e1",&cStack_160);
  pcStack_1a8 = (code *)0x1289e1;
  bson_decimal128_from_string("10e-1",auStack_170);
  uStack_198 = 0x3040000000000000;
  uStack_1a0 = 10;
  auVar13[0] = -(cStack_130 == '\n');
  auVar13[1] = -(cStack_12f == '\0');
  auVar13[2] = -(cStack_12e == '\0');
  auVar13[3] = -(cStack_12d == '\0');
  auVar13[4] = -(cStack_12c == '\0');
  auVar13[5] = -(cStack_12b == '\0');
  auVar13[6] = -(cStack_12a == '\0');
  auVar13[7] = -(cStack_129 == '\0');
  auVar13[8] = -(cStack_128 == '\0');
  auVar13[9] = -(cStack_127 == '\0');
  auVar13[10] = -(cStack_126 == '\0');
  auVar13[0xb] = -(cStack_125 == '\0');
  auVar13[0xc] = -(cStack_124 == '\0');
  auVar13[0xd] = -(cStack_123 == '\0');
  auVar13[0xe] = -(cStack_122 == '@');
  auVar13[0xf] = -(cStack_121 == '0');
  if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_198 = 0x3042000000000000;
    uStack_1a0 = 1;
    auVar14[0] = -(cStack_160 == '\x01');
    auVar14[1] = -(cStack_15f == '\0');
    auVar14[2] = -(cStack_15e == '\0');
    auVar14[3] = -(cStack_15d == '\0');
    auVar14[4] = -(cStack_15c == '\0');
    auVar14[5] = -(cStack_15b == '\0');
    auVar14[6] = -(cStack_15a == '\0');
    auVar14[7] = -(cStack_159 == '\0');
    auVar14[8] = -(cStack_158 == '\0');
    auVar14[9] = -(cStack_157 == '\0');
    auVar14[10] = -(cStack_156 == '\0');
    auVar14[0xb] = -(cStack_155 == '\0');
    auVar14[0xc] = -(cStack_154 == '\0');
    auVar14[0xd] = -(cStack_153 == '\0');
    auVar14[0xe] = -(cStack_152 == 'B');
    auVar14[0xf] = -(cStack_151 == '0');
    if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128b9e;
    uStack_198 = 0x303e000000000000;
    uStack_1a0 = 10;
    auVar15[0] = -(auStack_170[0] == '\n');
    auVar15[1] = -(auStack_170[1] == '\0');
    auVar15[2] = -(auStack_170[2] == '\0');
    auVar15[3] = -(auStack_170[3] == '\0');
    auVar15[4] = -(auStack_170[4] == '\0');
    auVar15[5] = -(auStack_170[5] == '\0');
    auVar15[6] = -(auStack_170[6] == '\0');
    auVar15[7] = -(auStack_170[7] == '\0');
    auVar15[8] = -(auStack_170[8] == '\0');
    auVar15[9] = -(auStack_170[9] == '\0');
    auVar15[10] = -(auStack_170[10] == '\0');
    auVar15[0xb] = -(auStack_170[0xb] == '\0');
    auVar15[0xc] = -(auStack_170[0xc] == '\0');
    auVar15[0xd] = -(auStack_170[0xd] == '\0');
    auVar15[0xe] = -(auStack_170[0xe] == '>');
    auVar15[0xf] = -(auStack_170[0xf] == '0');
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128ba3;
    pcVar1 = &cStack_140;
    pcStack_1a8 = (code *)0x128a92;
    bson_decimal128_from_string("12345678901234567e6111",pcVar1);
    pcStack_1a8 = (code *)0x128aa3;
    bson_decimal128_from_string("1e-6176",auStack_180);
    uStack_198 = 0x5ffe000000000000;
    uStack_1a0 = 0x2bdc545d6b4b87;
    auVar16[0] = -(cStack_140 == -0x79);
    auVar16[1] = -(cStack_13f == 'K');
    auVar16[2] = -(cStack_13e == 'k');
    auVar16[3] = -(cStack_13d == ']');
    auVar16[4] = -(cStack_13c == 'T');
    auVar16[5] = -(cStack_13b == -0x24);
    auVar16[6] = -(cStack_13a == '+');
    auVar16[7] = -(cStack_139 == '\0');
    auVar16[8] = -(cStack_138 == '\0');
    auVar16[9] = -(cStack_137 == '\0');
    auVar16[10] = -(cStack_136 == '\0');
    auVar16[0xb] = -(cStack_135 == '\0');
    auVar16[0xc] = -(cStack_134 == '\0');
    auVar16[0xd] = -(cStack_133 == '\0');
    auVar16[0xe] = -(cStack_132 == -2);
    auVar16[0xf] = -(cStack_131 == '_');
    if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | (ushort)(auVar16[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128ba8;
    uStack_198 = 0;
    uStack_1a0 = 1;
    auVar17[0] = -(auStack_180[0] == '\x01');
    auVar17[1] = -(auStack_180[1] == '\0');
    auVar17[2] = -(auStack_180[2] == '\0');
    auVar17[3] = -(auStack_180[3] == '\0');
    auVar17[4] = -(auStack_180[4] == '\0');
    auVar17[5] = -(auStack_180[5] == '\0');
    auVar17[6] = -(auStack_180[6] == '\0');
    auVar17[7] = -(auStack_180[7] == '\0');
    auVar17[8] = -(auStack_180[8] == '\0');
    auVar17[9] = -(auStack_180[9] == '\0');
    auVar17[10] = -(auStack_180[10] == '\0');
    auVar17[0xb] = -(auStack_180[0xb] == '\0');
    auVar17[0xc] = -(auStack_180[0xc] == '\0');
    auVar17[0xd] = -(auStack_180[0xd] == '\0');
    auVar17[0xe] = -(auStack_180[0xe] == '\0');
    auVar17[0xf] = -(auStack_180[0xf] == '\0');
    if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128bad;
    pcVar1 = &cStack_150;
    pcStack_1a8 = (code *)0x128b1f;
    bson_decimal128_from_string("-100E-10",pcVar1);
    pcStack_1a8 = (code *)0x128b30;
    bson_decimal128_from_string("10.50E8",&cStack_190);
    uStack_198 = 0xb02c000000000000;
    uStack_1a0 = 100;
    auVar18[0] = -(cStack_150 == 'd');
    auVar18[1] = -(cStack_14f == '\0');
    auVar18[2] = -(cStack_14e == '\0');
    auVar18[3] = -(cStack_14d == '\0');
    auVar18[4] = -(cStack_14c == '\0');
    auVar18[5] = -(cStack_14b == '\0');
    auVar18[6] = -(cStack_14a == '\0');
    auVar18[7] = -(cStack_149 == '\0');
    auVar18[8] = -(cStack_148 == '\0');
    auVar18[9] = -(cStack_147 == '\0');
    auVar18[10] = -(cStack_146 == '\0');
    auVar18[0xb] = -(cStack_145 == '\0');
    auVar18[0xc] = -(cStack_144 == '\0');
    auVar18[0xd] = -(cStack_143 == '\0');
    auVar18[0xe] = -(cStack_142 == ',');
    auVar18[0xf] = -(cStack_141 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128bb2;
    uStack_198 = 0x304c000000000000;
    uStack_1a0 = 0x41a;
    auVar19[0] = -(cStack_190 == '\x1a');
    auVar19[1] = -(cStack_18f == '\x04');
    auVar19[2] = -(cStack_18e == '\0');
    auVar19[3] = -(cStack_18d == '\0');
    auVar19[4] = -(cStack_18c == '\0');
    auVar19[5] = -(cStack_18b == '\0');
    auVar19[6] = -(cStack_18a == '\0');
    auVar19[7] = -(cStack_189 == '\0');
    auVar19[8] = -(cStack_188 == '\0');
    auVar19[9] = -(cStack_187 == '\0');
    auVar19[10] = -(cStack_186 == '\0');
    auVar19[0xb] = -(cStack_185 == '\0');
    auVar19[0xc] = -(cStack_184 == '\0');
    auVar19[0xd] = -(cStack_183 == '\0');
    auVar19[0xe] = -(cStack_182 == 'L');
    auVar19[0xf] = -(cStack_181 == '0');
    if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_1a8 = (code *)0x128b9e;
    test_decimal128_from_string__scientific_cold_1();
LAB_00128b9e:
    pcStack_1a8 = (code *)0x128ba3;
    test_decimal128_from_string__scientific_cold_2();
LAB_00128ba3:
    pcStack_1a8 = (code *)0x128ba8;
    test_decimal128_from_string__scientific_cold_3();
LAB_00128ba8:
    pcStack_1a8 = (code *)0x128bad;
    test_decimal128_from_string__scientific_cold_4();
LAB_00128bad:
    pcStack_1a8 = (code *)0x128bb2;
    test_decimal128_from_string__scientific_cold_5();
LAB_00128bb2:
    pcStack_1a8 = (code *)0x128bb7;
    test_decimal128_from_string__scientific_cold_6();
  }
  pcStack_1a8 = test_decimal128_from_string__large;
  test_decimal128_from_string__scientific_cold_7();
  pcStack_210 = (code *)0x128bd5;
  pcStack_1a8 = (code *)pcVar1;
  bson_decimal128_from_string("12345689012345789012345",&cStack_1b8);
  pcStack_210 = (code *)0x128be6;
  bson_decimal128_from_string("1234567890123456789012345678901234",&cStack_1c8);
  pcStack_210 = (code *)0x128bf7;
  bson_decimal128_from_string("9.999999999999999999999999999999999E+6144",&cStack_1d8);
  pcStack_210 = (code *)0x128c08;
  bson_decimal128_from_string("9.999999999999999999999999999999999E-6143",&cStack_1e8);
  pcStack_210 = (code *)0x128c19;
  bson_decimal128_from_string("5.192296858534827628530496329220095E+33",&cStack_1f8);
  uStack_200 = 0x304000000000029d;
  uStack_208 = 0x42da3a76f9e0d979;
  auVar20[0] = -(cStack_1b8 == 'y');
  auVar20[1] = -(cStack_1b7 == -0x27);
  auVar20[2] = -(cStack_1b6 == -0x20);
  auVar20[3] = -(cStack_1b5 == -7);
  auVar20[4] = -(cStack_1b4 == 'v');
  auVar20[5] = -(cStack_1b3 == ':');
  auVar20[6] = -(cStack_1b2 == -0x26);
  auVar20[7] = -(cStack_1b1 == 'B');
  auVar20[8] = -(cStack_1b0 == -99);
  auVar20[9] = -(cStack_1af == '\x02');
  auVar20[10] = -(cStack_1ae == '\0');
  auVar20[0xb] = -(cStack_1ad == '\0');
  auVar20[0xc] = -(cStack_1ac == '\0');
  auVar20[0xd] = -(cStack_1ab == '\0');
  auVar20[0xe] = -(cStack_1aa == '@');
  auVar20[0xf] = -(cStack_1a9 == '0');
  if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_200 = 0x30403cde6fff9732;
    uStack_208 = 0xde825cd07e96aff2;
    auVar21[0] = -(cStack_1c8 == -0xe);
    auVar21[1] = -(cStack_1c7 == -0x51);
    auVar21[2] = -(cStack_1c6 == -0x6a);
    auVar21[3] = -(cStack_1c5 == '~');
    auVar21[4] = -(cStack_1c4 == -0x30);
    auVar21[5] = -(cStack_1c3 == '\\');
    auVar21[6] = -(cStack_1c2 == -0x7e);
    auVar21[7] = -(cStack_1c1 == -0x22);
    auVar21[8] = -(cStack_1c0 == '2');
    auVar21[9] = -(cStack_1bf == -0x69);
    auVar21[10] = -(cStack_1be == -1);
    auVar21[0xb] = -(cStack_1bd == 'o');
    auVar21[0xc] = -(cStack_1bc == -0x22);
    auVar21[0xd] = -(cStack_1bb == '<');
    auVar21[0xe] = -(cStack_1ba == '@');
    auVar21[0xf] = -(cStack_1b9 == '0');
    if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128d2e;
    uStack_200 = 0x5fffed09bead87c0;
    uStack_208 = 0x378d8e63ffffffff;
    auVar22[0] = -(cStack_1d8 == -1);
    auVar22[1] = -(cStack_1d7 == -1);
    auVar22[2] = -(cStack_1d6 == -1);
    auVar22[3] = -(cStack_1d5 == -1);
    auVar22[4] = -(cStack_1d4 == 'c');
    auVar22[5] = -(cStack_1d3 == -0x72);
    auVar22[6] = -(cStack_1d2 == -0x73);
    auVar22[7] = -(cStack_1d1 == '7');
    auVar22[8] = -(cStack_1d0 == -0x40);
    auVar22[9] = -(cStack_1cf == -0x79);
    auVar22[10] = -(cStack_1ce == -0x53);
    auVar22[0xb] = -(cStack_1cd == -0x42);
    auVar22[0xc] = -(cStack_1cc == '\t');
    auVar22[0xd] = -(cStack_1cb == -0x13);
    auVar22[0xe] = -(cStack_1ca == -1);
    auVar22[0xf] = -(cStack_1c9 == '_');
    if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe | (ushort)(auVar22[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128d33;
    uStack_200 = 0x1ed09bead87c0;
    uStack_208 = 0x378d8e63ffffffff;
    auVar23[0] = -(cStack_1e8 == -1);
    auVar23[1] = -(cStack_1e7 == -1);
    auVar23[2] = -(cStack_1e6 == -1);
    auVar23[3] = -(cStack_1e5 == -1);
    auVar23[4] = -(cStack_1e4 == 'c');
    auVar23[5] = -(cStack_1e3 == -0x72);
    auVar23[6] = -(cStack_1e2 == -0x73);
    auVar23[7] = -(cStack_1e1 == '7');
    auVar23[8] = -(cStack_1e0 == -0x40);
    auVar23[9] = -(cStack_1df == -0x79);
    auVar23[10] = -(cStack_1de == -0x53);
    auVar23[0xb] = -(cStack_1dd == -0x42);
    auVar23[0xc] = -(cStack_1dc == '\t');
    auVar23[0xd] = -(cStack_1db == -0x13);
    auVar23[0xe] = -(cStack_1da == '\x01');
    auVar23[0xf] = -(cStack_1d9 == '\0');
    if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe | (ushort)(auVar23[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128d38;
    uStack_200 = 0x3040ffffffffffff;
    uStack_208 = 0xffffffffffffffff;
    auVar24[0] = -(cStack_1f8 == -1);
    auVar24[1] = -(cStack_1f7 == -1);
    auVar24[2] = -(cStack_1f6 == -1);
    auVar24[3] = -(cStack_1f5 == -1);
    auVar24[4] = -(cStack_1f4 == -1);
    auVar24[5] = -(cStack_1f3 == -1);
    auVar24[6] = -(cStack_1f2 == -1);
    auVar24[7] = -(cStack_1f1 == -1);
    auVar24[8] = -(cStack_1f0 == -1);
    auVar24[9] = -(cStack_1ef == -1);
    auVar24[10] = -(cStack_1ee == -1);
    auVar24[0xb] = -(cStack_1ed == -1);
    auVar24[0xc] = -(cStack_1ec == -1);
    auVar24[0xd] = -(cStack_1eb == -1);
    auVar24[0xe] = -(cStack_1ea == '@');
    auVar24[0xf] = -(cStack_1e9 == '0');
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe | (ushort)(auVar24[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_210 = (code *)0x128d2e;
    test_decimal128_from_string__large_cold_1();
LAB_00128d2e:
    pcStack_210 = (code *)0x128d33;
    test_decimal128_from_string__large_cold_2();
LAB_00128d33:
    pcStack_210 = (code *)0x128d38;
    test_decimal128_from_string__large_cold_3();
LAB_00128d38:
    pcStack_210 = (code *)0x128d3d;
    test_decimal128_from_string__large_cold_4();
  }
  pcStack_210 = test_decimal128_from_string__exponent_normalization;
  test_decimal128_from_string__large_cold_5();
  pcStack_210 = (code *)0x3040000000000000;
  pcStack_278 = (code *)0x128d67;
  pcStack_218 = &cStack_1b8;
  bson_decimal128_from_string("1000000000000000000000000000000000000000",&cStack_228);
  pcStack_278 = (code *)0x128d78;
  bson_decimal128_from_string("10000000000000000000000000000000000",&cStack_238);
  pcStack_278 = (code *)0x128d89;
  bson_decimal128_from_string("1000000000000000000000000000000000",&cStack_248);
  pcStack_278 = (code *)0x128d9a;
  bson_decimal128_from_string
            ("1000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,&cStack_258);
  uStack_260 = 0x304c314dc6448d93;
  uStack_268 = 0x38c15b0a00000000;
  auVar25[0] = -(cStack_228 == '\0');
  auVar25[1] = -(cStack_227 == '\0');
  auVar25[2] = -(cStack_226 == '\0');
  auVar25[3] = -(cStack_225 == '\0');
  auVar25[4] = -(cStack_224 == '\n');
  auVar25[5] = -(cStack_223 == '[');
  auVar25[6] = -(cStack_222 == -0x3f);
  auVar25[7] = -(cStack_221 == '8');
  auVar25[8] = -(cStack_220 == -0x6d);
  auVar25[9] = -(cStack_21f == -0x73);
  auVar25[10] = -(cStack_21e == 'D');
  auVar25[0xb] = -(cStack_21d == -0x3a);
  auVar25[0xc] = -(cStack_21c == 'M');
  auVar25[0xd] = -(cStack_21b == '1');
  auVar25[0xe] = -(cStack_21a == 'L');
  auVar25[0xf] = -(cStack_219 == '0');
  if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe | (ushort)(auVar25[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_260 = 0x3042314dc6448d93;
    uStack_268 = 0x38c15b0a00000000;
    auVar26[0] = -(cStack_238 == '\0');
    auVar26[1] = -(cStack_237 == '\0');
    auVar26[2] = -(cStack_236 == '\0');
    auVar26[3] = -(cStack_235 == '\0');
    auVar26[4] = -(cStack_234 == '\n');
    auVar26[5] = -(cStack_233 == '[');
    auVar26[6] = -(cStack_232 == -0x3f);
    auVar26[7] = -(cStack_231 == '8');
    auVar26[8] = -(cStack_230 == -0x6d);
    auVar26[9] = -(cStack_22f == -0x73);
    auVar26[10] = -(cStack_22e == 'D');
    auVar26[0xb] = -(cStack_22d == -0x3a);
    auVar26[0xc] = -(cStack_22c == 'M');
    auVar26[0xd] = -(cStack_22b == '1');
    auVar26[0xe] = -(cStack_22a == 'B');
    auVar26[0xf] = -(cStack_229 == '0');
    if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe | (ushort)(auVar26[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128e65;
    uStack_260 = 0x3040314dc6448d93;
    uStack_268 = 0x38c15b0a00000000;
    auVar27[0] = -(cStack_248 == '\0');
    auVar27[1] = -(cStack_247 == '\0');
    auVar27[2] = -(cStack_246 == '\0');
    auVar27[3] = -(cStack_245 == '\0');
    auVar27[4] = -(cStack_244 == '\n');
    auVar27[5] = -(cStack_243 == '[');
    auVar27[6] = -(cStack_242 == -0x3f);
    auVar27[7] = -(cStack_241 == '8');
    auVar27[8] = -(cStack_240 == -0x6d);
    auVar27[9] = -(cStack_23f == -0x73);
    auVar27[10] = -(cStack_23e == 'D');
    auVar27[0xb] = -(cStack_23d == -0x3a);
    auVar27[0xc] = -(cStack_23c == 'M');
    auVar27[0xd] = -(cStack_23b == '1');
    auVar27[0xe] = -(cStack_23a == '@');
    auVar27[0xf] = -(cStack_239 == '0');
    if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe | (ushort)(auVar27[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128e6a;
    uStack_260 = 0x37cc314dc6448d93;
    uStack_268 = 0x38c15b0a00000000;
    auVar28[0] = -(cStack_258 == '\0');
    auVar28[1] = -(cStack_257 == '\0');
    auVar28[2] = -(cStack_256 == '\0');
    auVar28[3] = -(cStack_255 == '\0');
    auVar28[4] = -(cStack_254 == '\n');
    auVar28[5] = -(cStack_253 == '[');
    auVar28[6] = -(cStack_252 == -0x3f);
    auVar28[7] = -(cStack_251 == '8');
    auVar28[8] = -(cStack_250 == -0x6d);
    auVar28[9] = -(cStack_24f == -0x73);
    auVar28[10] = -(cStack_24e == 'D');
    auVar28[0xb] = -(cStack_24d == -0x3a);
    auVar28[0xc] = -(cStack_24c == 'M');
    auVar28[0xd] = -(cStack_24b == '1');
    auVar28[0xe] = -(cStack_24a == -0x34);
    auVar28[0xf] = -(cStack_249 == '7');
    if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe | (ushort)(auVar28[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_278 = (code *)0x128e65;
    test_decimal128_from_string__exponent_normalization_cold_1();
LAB_00128e65:
    pcStack_278 = (code *)0x128e6a;
    test_decimal128_from_string__exponent_normalization_cold_2();
LAB_00128e6a:
    pcStack_278 = (code *)0x128e6f;
    test_decimal128_from_string__exponent_normalization_cold_3();
  }
  pcStack_278 = test_decimal128_from_string__zeros;
  test_decimal128_from_string__exponent_normalization_cold_4();
  pcStack_278 = (code *)&cStack_228;
  bson_decimal128_from_string("0",&cStack_288);
  bson_decimal128_from_string("0e-611",&cStack_298);
  bson_decimal128_from_string("0e+6000",&cStack_2a8);
  pcVar1 = "-0e-1";
  bson_decimal128_from_string("-0e-1",&cStack_2b8);
  auVar29[0] = -(cStack_288 == '\0');
  auVar29[1] = -(cStack_287 == '\0');
  auVar29[2] = -(cStack_286 == '\0');
  auVar29[3] = -(cStack_285 == '\0');
  auVar29[4] = -(cStack_284 == '\0');
  auVar29[5] = -(cStack_283 == '\0');
  auVar29[6] = -(cStack_282 == '\0');
  auVar29[7] = -(cStack_281 == '\0');
  auVar29[8] = -(cStack_280 == '\0');
  auVar29[9] = -(cStack_27f == '\0');
  auVar29[10] = -(cStack_27e == '\0');
  auVar29[0xb] = -(cStack_27d == '\0');
  auVar29[0xc] = -(cStack_27c == '\0');
  auVar29[0xd] = -(cStack_27b == '\0');
  auVar29[0xe] = -(cStack_27a == '@');
  auVar29[0xf] = -(cStack_279 == '0');
  if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf)
      == 0xffff) {
    auVar30[0] = -(cStack_298 == '\0');
    auVar30[1] = -(cStack_297 == '\0');
    auVar30[2] = -(cStack_296 == '\0');
    auVar30[3] = -(cStack_295 == '\0');
    auVar30[4] = -(cStack_294 == '\0');
    auVar30[5] = -(cStack_293 == '\0');
    auVar30[6] = -(cStack_292 == '\0');
    auVar30[7] = -(cStack_291 == '\0');
    auVar30[8] = -(cStack_290 == '\0');
    auVar30[9] = -(cStack_28f == '\0');
    auVar30[10] = -(cStack_28e == '\0');
    auVar30[0xb] = -(cStack_28d == '\0');
    auVar30[0xc] = -(cStack_28c == '\0');
    auVar30[0xd] = -(cStack_28b == '\0');
    auVar30[0xe] = -(cStack_28a == 'z');
    auVar30[0xf] = -(cStack_289 == '+');
    if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128f91;
    auVar31[0] = -(cStack_2a8 == '\0');
    auVar31[1] = -(cStack_2a7 == '\0');
    auVar31[2] = -(cStack_2a6 == '\0');
    auVar31[3] = -(cStack_2a5 == '\0');
    auVar31[4] = -(cStack_2a4 == '\0');
    auVar31[5] = -(cStack_2a3 == '\0');
    auVar31[6] = -(cStack_2a2 == '\0');
    auVar31[7] = -(cStack_2a1 == '\0');
    auVar31[8] = -(cStack_2a0 == '\0');
    auVar31[9] = -(cStack_29f == '\0');
    auVar31[10] = -(cStack_29e == '\0');
    auVar31[0xb] = -(cStack_29d == '\0');
    auVar31[0xc] = -(cStack_29c == '\0');
    auVar31[0xd] = -(cStack_29b == '\0');
    auVar31[0xe] = -(cStack_29a == ' ');
    auVar31[0xf] = -(cStack_299 == '_');
    if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf
                ) == 0xffff) {
      auVar32[0] = -(cStack_2b8 == '\0');
      auVar32[1] = -(cStack_2b7 == '\0');
      auVar32[2] = -(cStack_2b6 == '\0');
      auVar32[3] = -(cStack_2b5 == '\0');
      auVar32[4] = -(cStack_2b4 == '\0');
      auVar32[5] = -(cStack_2b3 == '\0');
      auVar32[6] = -(cStack_2b2 == '\0');
      auVar32[7] = -(cStack_2b1 == '\0');
      auVar32[8] = -(cStack_2b0 == '\0');
      auVar32[9] = -(cStack_2af == '\0');
      auVar32[10] = -(cStack_2ae == '\0');
      auVar32[0xb] = -(cStack_2ad == '\0');
      auVar32[0xc] = -(cStack_2ac == '\0');
      auVar32[0xd] = -(cStack_2ab == '\0');
      auVar32[0xe] = -(cStack_2aa == '>');
      auVar32[0xf] = -(cStack_2a9 == -0x50);
      if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar32[0xf] >> 7) << 0xf) == 0xffff) {
        return;
      }
      goto LAB_00128f9b;
    }
  }
  else {
    test_decimal128_from_string__zeros_cold_1();
LAB_00128f91:
    test_decimal128_from_string__zeros_cold_2();
  }
  test_decimal128_from_string__zeros_cold_3();
LAB_00128f9b:
  test_decimal128_from_string__zeros_cold_4();
  TestSuite_Add((TestSuite *)pcVar1,"/bson/error/basic",test_bson_error_basic);
  return;
}

Assistant:

static void
test_decimal128_from_string__nan (void)
{
   bson_decimal128_t dec;

   bson_decimal128_from_string ("NaN", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("+NaN", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("-NaN", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("-nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1e", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("+nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("Nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("+Nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("-Nan", &dec);
   BSON_ASSERT (IS_NAN (dec));
}